

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void __thiscall iqnet::ssl::Ctx::Ctx(Ctx *this,string *cert_path,string *key_path,bool client)

{
  int iVar1;
  Impl *this_00;
  SSL_CTX *pSVar2;
  type pIVar3;
  char *pcVar4;
  exception *this_01;
  SSL_METHOD *local_60;
  bool client_local;
  string *key_path_local;
  string *cert_path_local;
  Ctx *this_local;
  
  this_00 = (Impl *)operator_new(0x20);
  Impl::Impl(this_00);
  boost::shared_ptr<iqnet::ssl::Ctx::Impl>::shared_ptr<iqnet::ssl::Ctx::Impl>(&this->impl_,this_00);
  boost::call_once<void(&)()>((once_flag *)&ssl_init,init_library);
  if (client) {
    local_60 = (SSL_METHOD *)TLS_method();
  }
  else {
    local_60 = (SSL_METHOD *)TLS_server_method();
  }
  pSVar2 = SSL_CTX_new(local_60);
  pIVar3 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
  pIVar3->ctx = (SSL_CTX *)pSVar2;
  pIVar3 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
  anon_unknown_9::set_common_options(pIVar3->ctx);
  pIVar3 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
  pSVar2 = (SSL_CTX *)pIVar3->ctx;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar1 = SSL_CTX_use_certificate_file(pSVar2,pcVar4,1);
  if (iVar1 != 0) {
    pIVar3 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
    pSVar2 = (SSL_CTX *)pIVar3->ctx;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar1 = SSL_CTX_use_PrivateKey_file(pSVar2,pcVar4,1);
    if (iVar1 != 0) {
      pIVar3 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
      iVar1 = SSL_CTX_check_private_key((SSL_CTX *)pIVar3->ctx);
      if (iVar1 != 0) {
        return;
      }
    }
  }
  this_01 = (exception *)__cxa_allocate_exception(0x30);
  exception::exception(this_01);
  __cxa_throw(this_01,&exception::typeinfo,exception::~exception);
}

Assistant:

Ctx::Ctx( const std::string& cert_path, const std::string& key_path, bool client ):
  impl_(new Impl)
{
  boost::call_once(ssl_init, init_library);
  impl_->ctx = SSL_CTX_new( client ? SSLv23_method() : SSLv23_server_method() );
  set_common_options(impl_->ctx);

  if(
    !SSL_CTX_use_certificate_file( impl_->ctx, cert_path.c_str(), SSL_FILETYPE_PEM ) ||
    !SSL_CTX_use_PrivateKey_file( impl_->ctx, key_path.c_str(), SSL_FILETYPE_PEM ) ||
    !SSL_CTX_check_private_key( impl_->ctx )
  )
    throw exception();
}